

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O2

void __thiscall
baryonyx::itm::
solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
::solver_equalities_01coeff
          (solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  pointer pmVar1;
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  pointer pfVar5;
  
  (this->super_debug_logger<false>).ofs = (FILE *)0x0;
  this->rng = rng_;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  std::make_unique<double[]>((size_t)&this->P);
  compute_reduced_costs_vector_size(csts);
  std::
  make_unique<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,false>::rc_data[]>
            ((size_t)&this->R);
  std::make_unique<int[]>((size_t)&this->b);
  std::make_unique<double[]>((size_t)&this->pi);
  uVar4 = 0;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  pmVar1 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  piVar2 = (this->b)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  do {
    if (uVar4 == (uint)m_) {
      return;
    }
    pfVar5 = *(pointer *)
              &pmVar1[uVar4].elements.
               super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ._M_impl;
    while (pfVar5 != *(pointer *)
                      ((long)&pmVar1[uVar4].elements.
                              super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                              ._M_impl + 8)) {
      piVar3 = &pfVar5->factor;
      pfVar5 = pfVar5 + 1;
      if (*piVar3 != 1) {
        details::fail_fast("Postcondition","cst.factor == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-equalities-01.cpp"
                           ,"90");
      }
    }
    if (pmVar1[uVar4].min != pmVar1[uVar4].max) {
      details::fail_fast("Postcondition","csts[i].min == csts[i].max",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-equalities-01.cpp"
                         ,"93");
    }
    piVar2[uVar4] = pmVar1[uVar4].min;
    uVar4 = uVar4 + 1;
    m_ = this->m;
  } while( true );
}

Assistant:

solver_equalities_01coeff(random_engine& rng_,
                              int m_,
                              int n_,
                              const cost_type& c_,
                              const std::vector<merged_constraint>& csts)
      : logger("solver_equalities_01coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        for (int i = 0; i != m; ++i) {
#if !defined(BARYONYX_FULL_OPTIMIZATION)
            // mscv 15.9.6 fail to build this line:
            // for ([[maybe_unused]] const auto& cst : csts[i].elements)
            //    bx_ensures(cst.factor == 1);
            for (const auto& cst : csts[i].elements)
                bx_ensures(cst.factor == 1);
#endif

            bx_ensures(csts[i].min == csts[i].max);

            b[i] = csts[i].min;
        }
    }